

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::
Action<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>)>
::Perform(Action<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  ActionInterface<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>)>
  *pAVar3;
  undefined8 in_RSI;
  linked_ptr<testing::ActionInterface<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>)>_>
  *in_RDI;
  string *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 condition;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = IsDoDefault((Action<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>)>
                       *)0x18c22d);
  uVar2 = !bVar1;
  condition = (undefined1)((ulong)&local_31 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  internal::Assert((bool)condition,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  pAVar3 = internal::
           linked_ptr<testing::ActionInterface<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>)>_>
           ::operator->(in_RDI);
  (**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,in_RSI);
  return;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }